

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cpp
# Opt level: O1

void dlib::impl1::send_out_connection_orders
               (map_id_to_con *cons,
               vector<dlib::network_address,_std::allocator<dlib::network_address>_> *hosts)

{
  char cVar1;
  long *plVar2;
  unsigned_long *puVar3;
  range *prVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  vector<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_> targets;
  unsigned_long num;
  hostinfo info;
  vector<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_> local_88;
  unsigned_long local_68;
  value_type local_60;
  
  (**(code **)(*(long *)cons + 0x18))();
  while( true ) {
    cVar1 = (**(code **)(*(long *)cons + 0x38))(cons);
    if (cVar1 == '\0') break;
    plVar2 = (long *)(**(code **)(*(long *)cons + 0x30))(cons);
    puVar3 = (unsigned_long *)(**(code **)(*plVar2 + 0x10))(plVar2);
    plVar2 = (long *)(**(code **)(*(long *)cons + 0x30))(cons);
    plVar2 = (long *)(**(code **)(*plVar2 + 0x20))(plVar2);
    serialize(puVar3,(ostream *)(*plVar2 + 0x78));
  }
  local_88.super__Vector_base<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar7 = *(long *)hosts;
  if (*(long *)(hosts + 8) != lVar7) {
    puVar3 = &local_60.node_id;
    lVar5 = 0;
    uVar6 = 0;
    do {
      local_60.addr.host_address._M_dataplus._M_p = (pointer)&local_60.addr.host_address.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,*(long *)(lVar7 + lVar5),
                 *(long *)(lVar7 + 8 + lVar5) + *(long *)(lVar7 + lVar5));
      uVar6 = uVar6 + 1;
      local_60.addr.port = *(unsigned_short *)(lVar7 + 0x20 + lVar5);
      local_60.node_id = uVar6;
      prVar4 = map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
               ::operator[](cons,puVar3);
      serialize<dlib::impl1::hostinfo,std::allocator<dlib::impl1::hostinfo>>
                (&local_88,
                 (ostream *)
                 ((long)&(((prVar4->_M_t).
                           super___uniq_ptr_impl<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_dlib::impl1::bsp_con_*,_std::default_delete<dlib::impl1::bsp_con>_>
                           .super__Head_base<0UL,_dlib::impl1::bsp_con_*,_false>._M_head_impl)->
                         stream).super_basic_istream<char,_std::char_traits<char>_> + 0x10));
      std::vector<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_>::push_back
                (&local_88,&local_60);
      local_68 = ((long)local_88.
                        super__Vector_base<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_88.
                        super__Vector_base<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x5555555555555555 +
                 (*(long *)(hosts + 8) - *(long *)hosts >> 3) * -0x3333333333333333;
      prVar4 = map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
               ::operator[](cons,puVar3);
      serialize(&local_68,
                (ostream *)
                ((long)&(((prVar4->_M_t).
                          super___uniq_ptr_impl<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_dlib::impl1::bsp_con_*,_std::default_delete<dlib::impl1::bsp_con>_>
                          .super__Head_base<0UL,_dlib::impl1::bsp_con_*,_false>._M_head_impl)->
                        stream).super_basic_istream<char,_std::char_traits<char>_> + 0x10));
      map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
      ::operator[](cons,puVar3);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.addr.host_address._M_dataplus._M_p != &local_60.addr.host_address.field_2) {
        operator_delete(local_60.addr.host_address._M_dataplus._M_p);
      }
      lVar7 = *(long *)hosts;
      lVar5 = lVar5 + 0x28;
    } while (uVar6 < (ulong)((*(long *)(hosts + 8) - lVar7 >> 3) * -0x3333333333333333));
  }
  std::vector<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_>::~vector(&local_88);
  return;
}

Assistant:

void send_out_connection_orders (
            map_id_to_con& cons,
            const std::vector<network_address>& hosts
        )
        {
            // tell everyone their node ids
            cons.reset();
            while (cons.move_next())
            {
                dlib::serialize(cons.element().key(), cons.element().value()->stream);
            }

            // now tell them who to connect to
            std::vector<hostinfo> targets; 
            for (unsigned long i = 0; i < hosts.size(); ++i)
            {
                hostinfo info(hosts[i], i+1);

                dlib::serialize(targets, cons[info.node_id]->stream);
                targets.push_back(info);

                // let the other host know how many incoming connections to expect
                const unsigned long num = hosts.size()-targets.size();
                dlib::serialize(num, cons[info.node_id]->stream);
                cons[info.node_id]->stream.flush();
            }
        }